

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O1

int SUNHashMap_Insert(SUNHashMap map,char *key,void *value)

{
  uint uVar1;
  SUNHashMapKeyValue *ppSVar2;
  long lVar3;
  SUNHashMapKeyValue pSVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  char cVar9;
  ulong uVar10;
  
  iVar5 = -1;
  if (value != (void *)0x0 && (key != (char *)0x0 && map != (SUNHashMap)0x0)) {
    uVar10 = 0x100000001b3;
    cVar9 = *key;
    if (cVar9 == '\0') {
      uVar10 = 0x100000001b3;
    }
    else {
      pcVar7 = key + 1;
      do {
        uVar10 = ((long)cVar9 ^ uVar10) * -0x340d631b7bdddcdb;
        cVar9 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while (cVar9 != '\0');
    }
    uVar1 = map->max_size;
    ppSVar2 = map->buckets;
    uVar6 = (uint)(uVar10 % (ulong)(long)(int)uVar1);
    if (ppSVar2[(int)uVar6] != (SUNHashMapKeyValue)0x0) {
      uVar8 = uVar1;
      if ((int)uVar6 < (int)uVar1) {
        lVar3 = (long)(int)uVar6;
        do {
          uVar8 = -(uint)(ppSVar2[lVar3] != (SUNHashMapKeyValue)0x0) | (uint)lVar3;
          if (uVar8 != 0xffffffff) break;
          lVar3 = lVar3 + 1;
          uVar8 = uVar1;
        } while (lVar3 < (int)uVar1);
      }
      if ((int)uVar8 < 0) {
        return -1;
      }
      uVar6 = uVar8;
      if (uVar8 == uVar1) {
        return -2;
      }
    }
    pSVar4 = (SUNHashMapKeyValue)malloc(0x10);
    iVar5 = -1;
    if (pSVar4 != (SUNHashMapKeyValue)0x0) {
      pSVar4->key = key;
      pSVar4->value = value;
      ppSVar2[(int)uVar6] = pSVar4;
      map->size = map->size + 1;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int SUNHashMap_Insert(SUNHashMap map, const char* key, void* value)
{
  int idx;
  int retval;
  SUNHashMapKeyValue kvp;

  if (map == NULL || key == NULL || value == NULL) { return (-1); }

  /* We want the index to be in (0, map->max_size) */
  idx = (int)(fnv1a_hash(key) % map->max_size);

  /* Check if the bucket is already filled */
  if (map->buckets[idx] != NULL)
  {
    /* Find the next open spot */
    retval = SUNHashMap_Iterate(map, idx, sunHashMapLinearProbeInsert, NULL);
    if (retval < 0) { return (-1); /* error occurred */ }
    if (retval == map->max_size) { return (-2); /* no open entry */ }

    idx = retval;
  }

  /* Create the key-value pair */
  kvp = (SUNHashMapKeyValue)malloc(sizeof(*kvp));
  if (kvp == NULL) { return (-1); }

  kvp->key   = key;
  kvp->value = value;

  /* Insert the key-value pair */
  map->buckets[idx] = kvp;
  map->size++;

  return (0);
}